

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_cells_aa.h
# Opt level: O3

void __thiscall
agg::rasterizer_cells_aa<agg::cell_aa>::sort_cells(rasterizer_cells_aa<agg::cell_aa> *this)

{
  sorted_y *psVar1;
  int iVar2;
  uint uVar3;
  cell_type *pcVar4;
  sorted_y *psVar5;
  int iVar6;
  int iVar7;
  cell_type **ppcVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  cell_type **ppcVar13;
  uint uVar14;
  cell_type *pcVar15;
  uint uVar16;
  uint uVar17;
  int *piVar18;
  
  if (this->m_sorted != false) {
    return;
  }
  pcVar15 = &this->m_curr_cell;
  uVar10 = this->m_num_cells;
  if ((this->m_curr_cell).cover != 0 || (this->m_curr_cell).area != 0) {
    if ((uVar10 & 0xfff) == 0) {
      if (0x3ff < this->m_num_blocks) goto LAB_001134ff;
      allocate_block(this);
    }
    pcVar4 = this->m_curr_cell_ptr;
    this->m_curr_cell_ptr = pcVar4 + 1;
    iVar2 = pcVar15->y;
    iVar6 = (this->m_curr_cell).cover;
    iVar7 = (this->m_curr_cell).area;
    pcVar4->x = pcVar15->x;
    pcVar4->y = iVar2;
    pcVar4->cover = iVar6;
    pcVar4->area = iVar7;
    uVar10 = this->m_num_cells + 1;
    this->m_num_cells = uVar10;
  }
LAB_001134ff:
  pcVar15->x = 0x7fffffff;
  pcVar15->y = 0x7fffffff;
  (this->m_curr_cell).cover = 0;
  (this->m_curr_cell).area = 0;
  if (uVar10 != 0) {
    pod_vector<agg::cell_aa_*>::capacity(&this->m_sorted_cells,uVar10,0x10);
    (this->m_sorted_cells).m_size = uVar10;
    uVar10 = (this->m_max_y - this->m_min_y) + 1;
    pod_vector<agg::rasterizer_cells_aa<agg::cell_aa>::sorted_y>::capacity
              (&this->m_sorted_y,uVar10,0x10);
    (this->m_sorted_y).m_size = uVar10;
    memset((this->m_sorted_y).m_array,0,(ulong)uVar10 << 3);
    ppcVar8 = this->m_cells;
    uVar10 = this->m_num_cells;
    if (uVar10 != 0) {
      iVar2 = this->m_min_y;
      psVar5 = (this->m_sorted_y).m_array;
      ppcVar13 = ppcVar8;
      uVar14 = uVar10;
      do {
        uVar16 = 0x1000;
        if (uVar14 < 0x1000) {
          uVar16 = uVar14;
        }
        piVar18 = &(*ppcVar13)->y;
        uVar11 = uVar16;
        do {
          psVar1 = psVar5 + (uint)(*piVar18 - iVar2);
          psVar1->start = psVar1->start + 1;
          piVar18 = piVar18 + 4;
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
        ppcVar13 = ppcVar13 + 1;
        uVar14 = uVar14 - uVar16;
      } while (uVar14 != 0);
    }
    uVar14 = (this->m_sorted_y).m_size;
    uVar9 = (ulong)uVar14;
    if (uVar9 != 0) {
      psVar5 = (this->m_sorted_y).m_array;
      uVar12 = 0;
      uVar16 = 0;
      do {
        uVar11 = psVar5[uVar12].start;
        psVar5[uVar12].start = uVar16;
        uVar12 = uVar12 + 1;
        uVar16 = uVar11 + uVar16;
      } while (uVar9 != uVar12);
    }
    if (uVar10 != 0) {
      iVar2 = this->m_min_y;
      do {
        pcVar15 = *ppcVar8;
        uVar16 = 0x1000;
        uVar11 = 0x1000;
        if (uVar10 < 0x1000) {
          uVar16 = uVar10;
          uVar11 = uVar10;
        }
        do {
          uVar17 = pcVar15->y - iVar2;
          psVar5 = (this->m_sorted_y).m_array;
          uVar3 = psVar5[uVar17].num;
          (this->m_sorted_cells).m_array[psVar5[uVar17].start + uVar3] = pcVar15;
          pcVar15 = pcVar15 + 1;
          psVar5[uVar17].num = uVar3 + 1;
          uVar16 = uVar16 - 1;
        } while (uVar16 != 0);
        ppcVar8 = ppcVar8 + 1;
        uVar10 = uVar10 - uVar11;
      } while (uVar10 != 0);
    }
    if (uVar14 != 0) {
      uVar12 = 0;
      do {
        psVar5 = (this->m_sorted_y).m_array;
        uVar10 = psVar5[uVar12].num;
        if (uVar10 != 0) {
          qsort_cells<agg::cell_aa>((this->m_sorted_cells).m_array + psVar5[uVar12].start,uVar10);
          uVar9 = (ulong)(this->m_sorted_y).m_size;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < uVar9);
    }
    this->m_sorted = true;
  }
  return;
}

Assistant:

void rasterizer_cells_aa<Cell>::sort_cells()
    {
        if(m_sorted) return; //Perform sort only the first time.

        add_curr_cell();
        m_curr_cell.x     = std::numeric_limits<int>::max();
        m_curr_cell.y     = std::numeric_limits<int>::max();
        m_curr_cell.cover = 0;
        m_curr_cell.area  = 0;

        if(m_num_cells == 0) return;

// DBG: Check to see if min/max works well.
//for(unsigned nc = 0; nc < m_num_cells; nc++)
//{
//    cell_type* cell = m_cells[nc >> cell_block_shift] + (nc & cell_block_mask);
//    if(cell->x < m_min_x || 
//       cell->y < m_min_y || 
//       cell->x > m_max_x || 
//       cell->y > m_max_y)
//    {
//        cell = cell; // Breakpoint here
//    }
//}
        // Allocate the array of cell pointers
        m_sorted_cells.allocate(m_num_cells, 16);

        // Allocate and zero the Y array
        m_sorted_y.allocate(m_max_y - m_min_y + 1, 16);
        m_sorted_y.zero();

        // Create the Y-histogram (count the numbers of cells for each Y)
        cell_type** block_ptr = m_cells;
        cell_type*  cell_ptr;
        unsigned nb = m_num_cells;
        unsigned i;
        while(nb)
        {
            cell_ptr = *block_ptr++;
            i = (nb > cell_block_size) ? unsigned(cell_block_size) : nb;
            nb -= i;
            while(i--) 
            {
                m_sorted_y[cell_ptr->y - m_min_y].start++;
                ++cell_ptr;
            }
        }

        // Convert the Y-histogram into the array of starting indexes
        unsigned start = 0;
        for(i = 0; i < m_sorted_y.size(); i++)
        {
            unsigned v = m_sorted_y[i].start;
            m_sorted_y[i].start = start;
            start += v;
        }

        // Fill the cell pointer array sorted by Y
        block_ptr = m_cells;
        nb = m_num_cells;
        while(nb)
        {
            cell_ptr = *block_ptr++;
            i = (nb > cell_block_size) ? unsigned(cell_block_size) : nb;
            nb -= i;
            while(i--)
            {
                sorted_y& curr_y = m_sorted_y[cell_ptr->y - m_min_y];
                m_sorted_cells[curr_y.start + curr_y.num] = cell_ptr;
                ++curr_y.num;
                ++cell_ptr;
            }
        }
        
        // Finally arrange the X-arrays
        for(i = 0; i < m_sorted_y.size(); i++)
        {
            const sorted_y& curr_y = m_sorted_y[i];
            if(curr_y.num)
            {
                qsort_cells(m_sorted_cells.data() + curr_y.start, curr_y.num);
            }
        }
        m_sorted = true;
    }